

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O1

curltime cf_get_max_baller_time(Curl_cfilter *cf,Curl_easy *data,int query)

{
  void *pvVar1;
  long *plVar2;
  int iVar3;
  timediff_t tVar4;
  ulong uVar5;
  long *plVar6;
  curltime cVar7;
  curltime newer;
  curltime older;
  curltime t;
  ulong local_58;
  time_t local_50;
  long local_48;
  uint uStack_40;
  undefined4 uStack_3c;
  
  pvVar1 = cf->ctx;
  if (*(long *)((long)pvVar1 + 0x98) == 0) {
    local_58 = 0;
    local_50 = 0;
  }
  else {
    plVar6 = (long *)((long)pvVar1 + 0x30);
    local_50 = 0;
    uVar5 = 0;
    local_58 = 0;
    do {
      plVar2 = (long *)*plVar6;
      local_48 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      if ((((plVar2 != (long *)0x0) &&
           (iVar3 = (**(code **)(*plVar2 + 0x70))(plVar2,data,query,0,&local_48), iVar3 == 0)) &&
          (newer.tv_usec = uStack_40, newer.tv_sec = local_48, uStack_40 != 0 || local_48 != 0)) &&
         (newer._12_4_ = 0, older._8_8_ = local_58, older.tv_sec = local_50,
         tVar4 = Curl_timediff_us(newer,older), 0 < tVar4)) {
        local_50 = local_48;
        local_58 = (ulong)uStack_40;
      }
      uVar5 = uVar5 + 1;
      plVar6 = plVar6 + 7;
    } while (uVar5 < *(ulong *)((long)pvVar1 + 0x98));
  }
  cVar7._8_8_ = local_58;
  cVar7.tv_sec = local_50;
  return cVar7;
}

Assistant:

static struct curltime cf_get_max_baller_time(struct Curl_cfilter *cf,
                                              struct Curl_easy *data,
                                              int query)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct curltime t, tmax;
  size_t i;

  memset(&tmax, 0, sizeof(tmax));
  for(i = 0; i < ctx->baller_count; i++) {
    struct Curl_cfilter *cfb = ctx->ballers[i].cf;
    memset(&t, 0, sizeof(t));
    if(cfb && !cfb->cft->query(cfb, data, query, NULL, &t)) {
      if((t.tv_sec || t.tv_usec) && Curl_timediff_us(t, tmax) > 0)
        tmax = t;
    }
  }
  return tmax;
}